

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O2

void and_or_test(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  bitset_container_t *bitset_02;
  ulong uVar4;
  size_t x_1;
  uint uVar5;
  int iVar6;
  size_t x;
  ulong uVar7;
  bool bVar8;
  
  bitset = bitset_container_create();
  bitset_00 = bitset_container_create();
  bitset_01 = bitset_container_create();
  bitset_02 = bitset_container_create();
  iVar1 = bitset_container_compute_cardinality(bitset);
  _assert_true((ulong)(iVar1 == 0),"bitset_container_compute_cardinality(B1) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x6d);
  iVar1 = bitset_container_compute_cardinality(bitset_00);
  _assert_true((ulong)(iVar1 == 0),"bitset_container_compute_cardinality(B2) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x6e);
  iVar1 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar1 == 0),"bitset_container_compute_cardinality(BI) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x6f);
  iVar1 = bitset_container_compute_cardinality(bitset_02);
  _assert_true((ulong)(iVar1 == 0),"bitset_container_compute_cardinality(BO) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x70);
  _assert_true((unsigned_long)bitset,"B1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x72);
  _assert_true((unsigned_long)bitset_00,"B2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x73);
  _assert_true((unsigned_long)bitset_01,"BI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x74);
  _assert_true((unsigned_long)bitset_02,"BO",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x75);
  for (uVar7 = 0; uVar7 < 60000; uVar7 = uVar7 + 3) {
    bitset_container_set(bitset,(uint16_t)uVar7);
    bitset_container_set(bitset_01,(uint16_t)uVar7);
  }
  for (uVar7 = 0; uVar7 < 60000; uVar7 = uVar7 + 3) {
    _assert_true((ulong)((bitset->words[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0),
                 "bitset_container_get(B1, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x82);
    _assert_true((ulong)((bitset_01->words[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0),
                 "bitset_container_get(BI, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x83);
  }
  iVar1 = bitset_container_compute_cardinality(bitset);
  iVar6 = 20000;
  _assert_true((ulong)(iVar1 == 20000),"bitset_container_compute_cardinality(B1) == b1_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x86);
  iVar1 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar1 == 20000),"bitset_container_compute_cardinality(BI) == bi_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x87);
  for (uVar7 = 0; uVar7 < 60000; uVar7 = uVar7 + 0x3e) {
    iVar6 = (iVar6 + 1) - (uint)((bitset_01->words[uVar7 >> 6] >> ((uint)uVar7 & 0x3e) & 1) != 0);
    bitset_container_set(bitset_00,(uint16_t)uVar7);
    bitset_container_set(bitset_01,(uint16_t)uVar7);
  }
  iVar1 = bitset_container_compute_cardinality(bitset_00);
  _assert_true((ulong)(iVar1 == 0x3c8),"bitset_container_compute_cardinality(B2) == b2_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x93);
  iVar1 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar1 == iVar6),"bitset_container_compute_cardinality(BI) == bi_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x94);
  for (uVar7 = 0; uVar7 < 60000; uVar7 = uVar7 + 0xba) {
    bitset_container_set(bitset_02,(uint16_t)uVar7);
  }
  iVar1 = bitset_container_compute_cardinality(bitset_02);
  _assert_true((ulong)(iVar1 == 0x143),"bitset_container_compute_cardinality(BO) == bo_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x9b);
  iVar1 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar1 == iVar6),"bitset_container_compute_cardinality(BI) == bi_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x9c);
  iVar1 = bitset_container_compute_cardinality(bitset_01);
  iVar2 = bitset_container_compute_cardinality(bitset_02);
  iVar3 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar3 == iVar1),"bitset_container_compute_cardinality(BI) == card_union",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x9f);
  _assert_true((ulong)(iVar6 == iVar1),"bi_count == card_union",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xa0);
  iVar6 = bitset_container_compute_cardinality(bitset_02);
  _assert_true((ulong)(iVar6 == 0x143),"bitset_container_compute_cardinality(BO) == bo_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xa1);
  iVar6 = bitset_container_compute_cardinality(bitset_02);
  iVar3 = bitset_container_compute_cardinality(bitset_02);
  _assert_true((ulong)(iVar6 == iVar3),
               "bitset_container_compute_cardinality(BO) == bitset_container_compute_cardinality(BO)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xa3);
  _assert_true((ulong)(iVar2 == 0x143),"card_inter == bo_count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xa4);
  bitset_container_printf(bitset);
  bitset_container_printf(bitset_00);
  bitset_container_printf(bitset_01);
  bitset_container_andnot_nocard(bitset,bitset_00,bitset_01);
  bitset_container_printf(bitset);
  bitset_container_printf(bitset_00);
  bitset_container_printf(bitset_01);
  iVar6 = 0;
  for (uVar7 = 0; uVar7 != 60000; uVar7 = uVar7 + 1) {
    uVar4 = uVar7 >> 6;
    uVar5 = (uint)uVar7 & 0x3f;
    bVar8 = (bitset_01->words[uVar4] >> uVar5 & 1) != 0;
    _assert_true((ulong)(bVar8 != ((bitset_00->words[uVar4] >> uVar5 & 1) != 0 ||
                                  (bitset->words[uVar4] >> uVar5 & 1) == 0)),"ini == (in1 & !in2)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0xb3);
    iVar6 = iVar6 + (uint)bVar8;
  }
  iVar3 = bitset_container_compute_cardinality(bitset_01);
  _assert_true((ulong)(iVar3 == iVar6),"bitset_container_compute_cardinality(BI) == interc",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xb6);
  iVar6 = bitset_container_compute_cardinality(bitset_01);
  _assert_int_not_equal
            ((long)iVar6,(long)iVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
             ,0xb7);
  iVar6 = bitset_container_and(bitset,bitset_00,bitset_01);
  _assert_int_not_equal
            ((long)iVar6,(long)iVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
             ,0xb8);
  bitset_container_or_nocard(bitset,bitset_00,bitset_02);
  iVar1 = bitset_container_compute_cardinality(bitset_02);
  _assert_int_not_equal
            ((long)iVar1,(long)iVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
             ,0xba);
  iVar1 = bitset_container_or(bitset,bitset_00,bitset_02);
  _assert_int_not_equal
            ((long)iVar1,(long)iVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
             ,0xbb);
  bitset_container_free(bitset);
  bitset_container_free(bitset_00);
  bitset_container_free(bitset_01);
  bitset_container_free(bitset_02);
  return;
}

Assistant:

DEFINE_TEST(and_or_test) {
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BI = bitset_container_create();
    bitset_container_t* BO = bitset_container_create();
    assert_true(bitset_container_compute_cardinality(B1) == 0);
    assert_true(bitset_container_compute_cardinality(B2) == 0);
    assert_true(bitset_container_compute_cardinality(BI) == 0);
    assert_true(bitset_container_compute_cardinality(BO) == 0);

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(BO);

    size_t max_value = 60000;

    int b1_count = 0;
    int bi_count = 0;
    for (size_t x = 0; x < max_value; x += 3) {
        bitset_container_set(B1, x);
        bitset_container_set(BI, x);
        b1_count++;
        bi_count++;
    }
    for (size_t x = 0; x < max_value; x += 3) {
        assert_true(bitset_container_get(B1, x));
        assert_true(bitset_container_get(BI, x));
    }

    assert_true(bitset_container_compute_cardinality(B1) == b1_count);
    assert_true(bitset_container_compute_cardinality(BI) == bi_count);

    int b2_count = 0;
    // important: 62 is not divisible by 3
    for (size_t x = 0; x < max_value; x += 62) {
        bi_count += !bitset_container_get(BI, x);

        bitset_container_set(B2, x);
        bitset_container_set(BI, x);
        b2_count++;
    }

    assert_true(bitset_container_compute_cardinality(B2) == b2_count);
    assert_true(bitset_container_compute_cardinality(BI) == bi_count);
    int bo_count = 0;
    for (size_t x = 0; x < max_value; x += 62 * 3) {
        bitset_container_set(BO, x);
        bo_count++;
    }

    assert_true(bitset_container_compute_cardinality(BO) == bo_count);
    assert_true(bitset_container_compute_cardinality(BI) == bi_count);
    const int card_union = bitset_container_compute_cardinality(BI);
    const int card_inter = bitset_container_compute_cardinality(BO);
    assert_true(bitset_container_compute_cardinality(BI) == card_union);
    assert_true(bi_count == card_union);
    assert_true(bitset_container_compute_cardinality(BO) == bo_count);
    assert_true(bitset_container_compute_cardinality(BO) ==
                bitset_container_compute_cardinality(BO));
    assert_true(card_inter == bo_count);
    bitset_container_printf(B1);  // does it crash?
    bitset_container_printf(B2);  // does it crash?
    bitset_container_printf(BI);  // does it crash?

    bitset_container_andnot_nocard(B1, B2, BI);

    bitset_container_printf(B1);  // does it crash?
    bitset_container_printf(B2);  // does it crash?
    bitset_container_printf(BI);  // does it crash?
    int interc = 0;
    for (size_t x = 0; x < max_value; x++) {
        bool in1 = bitset_container_get(B1, x);
        bool in2 = bitset_container_get(B2, x);
        bool ini = bitset_container_get(BI, x);
        assert_true(ini == (in1 & !in2));
        interc += ini;
    }
    assert_true(bitset_container_compute_cardinality(BI) == interc);
    assert_int_not_equal(bitset_container_compute_cardinality(BI), card_union);
    assert_int_not_equal(bitset_container_and(B1, B2, BI), card_union);
    bitset_container_or_nocard(B1, B2, BO);
    assert_int_not_equal(bitset_container_compute_cardinality(BO), card_inter);
    assert_int_not_equal(bitset_container_or(B1, B2, BO), card_inter);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(BI);
    bitset_container_free(BO);
}